

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
          (writer_base<cppwinrt::writer> *this,string_view *value,TypeDef *args,
          coded_index<winmd::reader::TypeDefOrRef> *args_1)

{
  coded_index<winmd::reader::TypeDefOrRef> *args_local_1;
  TypeDef *args_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  write_segment<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
            (this,value,args,args_1);
  return;
}

Assistant:

void write(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            auto expected = count_placeholders(value);
            auto actual = sizeof...(Args);
            assert(expected == actual);
#endif
            write_segment(value, args...);
        }